

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator=(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SPxOut *pSVar4;
  int32_t iVar5;
  
  if (this != old) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(&this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&old->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(&this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&old->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    this->thesense = old->thesense;
    *(undefined8 *)((this->offset).m_backend.data._M_elems + 8) =
         *(undefined8 *)((old->offset).m_backend.data._M_elems + 8);
    uVar1 = *(undefined8 *)(old->offset).m_backend.data._M_elems;
    uVar2 = *(undefined8 *)((old->offset).m_backend.data._M_elems + 2);
    uVar3 = *(undefined8 *)((old->offset).m_backend.data._M_elems + 6);
    *(undefined8 *)((this->offset).m_backend.data._M_elems + 4) =
         *(undefined8 *)((old->offset).m_backend.data._M_elems + 4);
    *(undefined8 *)((this->offset).m_backend.data._M_elems + 6) = uVar3;
    *(undefined8 *)(this->offset).m_backend.data._M_elems = uVar1;
    *(undefined8 *)((this->offset).m_backend.data._M_elems + 2) = uVar2;
    (this->offset).m_backend.exp = (old->offset).m_backend.exp;
    (this->offset).m_backend.neg = (old->offset).m_backend.neg;
    iVar5 = (old->offset).m_backend.prec_elem;
    (this->offset).m_backend.fpclass = (old->offset).m_backend.fpclass;
    (this->offset).m_backend.prec_elem = iVar5;
    this->_isScaled = old->_isScaled;
    pSVar4 = old->spxout;
    this->lp_scaler = old->lp_scaler;
    this->spxout = pSVar4;
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (old->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(old->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return this;
}

Assistant:

SPxLPBase<R>& operator=(const SPxLPBase<R>& old)
   {
      if(this != &old)
      {
         LPRowSetBase<R>::operator=(old);
         LPColSetBase<R>::operator=(old);
         thesense = old.thesense;
         offset = old.offset;
         _isScaled = old._isScaled;
         lp_scaler = old.lp_scaler;
         spxout = old.spxout;
         _tolerances = old._tolerances;

         assert(isConsistent());
      }

      return *this;
   }